

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio_utils.cpp
# Opt level: O2

bool emptystr(string *input,string *comments)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  regex emptyregex;
  
  std::operator+(&local_78,"^\\s*[",comments);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &emptyregex._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,&local_78,"]+.*\\n*$|^\\s*\\n*$");
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &emptyregex._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,0x10);
  std::__cxx11::string::~string
            ((string *)
             &emptyregex._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (input,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_58,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_58);
  return bVar1;
}

Assistant:

bool emptystr(const string& input, const string& comments) {
  const regex emptyregex(R"(^\s*[)"+comments+R"(]+.*\n*$|^\s*\n*$)");
  return regex_match(input, emptyregex);
}